

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_impl.h
# Opt level: O3

void bench_ellswift_setup(void *arg)

{
  uchar *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  char *pcVar22;
  ulong uVar23;
  uint uVar24;
  undefined8 *puVar25;
  uint uVar26;
  long lVar27;
  undefined1 *puVar28;
  long lVar29;
  char **argv;
  int argc;
  undefined8 *puVar30;
  undefined8 *puVar31;
  char *pcVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  undefined8 *puVar37;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  char in_XMM1_Bp;
  int in_stack_fffffffffffffd18;
  char **ppcStack_2e0;
  undefined8 uStack_2c8;
  undefined8 uStack_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 auStack_280 [72];
  undefined8 uStack_238;
  undefined1 auStack_230 [40];
  undefined8 uStack_208;
  undefined1 auStack_200 [64];
  undefined1 auStack_1c0 [64];
  undefined8 uStack_180;
  ulong uStack_178;
  ulong uStack_170;
  undefined8 *puStack_168;
  undefined8 *puStack_160;
  code *pcStack_158;
  int iStack_14c;
  undefined8 *puStack_148;
  undefined8 uStack_140;
  ulong uStack_138;
  undefined8 *puStack_130;
  undefined1 *puStack_128;
  undefined8 *puStack_120;
  undefined8 *puStack_118;
  code *pcStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  ulong uStack_c8;
  undefined1 *puStack_c0;
  undefined1 *puStack_b8;
  undefined8 *puStack_b0;
  code *pcStack_a8;
  undefined8 uStack_a0;
  undefined1 auStack_98 [64];
  void *pvStack_58;
  long lStack_50;
  undefined8 uVar32;
  
  lVar29 = (long)arg + 0x4008;
  puVar1 = (uchar *)((long)arg + 0x4038);
  puVar1[0] = 'H';
  puVar1[1] = 'Q';
  puVar1[2] = '\x1e';
  puVar1[3] = 0xd4;
  puVar1[4] = '\x16';
  puVar1[5] = 0xfd;
  puVar1[6] = 'B';
  puVar1[7] = 0x85;
  puVar1 = (uchar *)((long)arg + 0x4040);
  puVar1[0] = 'b';
  puVar1[1] = 0xc9;
  puVar1[2] = '\x02';
  puVar1[3] = 0xf9;
  puVar1[4] = 0x89;
  puVar1[5] = 0x84;
  puVar1[6] = 0xff;
  puVar1[7] = 0xdc;
  puVar1 = (uchar *)((long)arg + 0x4028);
  puVar1[0] = 0xb0;
  puVar1[1] = ',';
  puVar1[2] = 'F';
  puVar1[3] = 0xd8;
  puVar1[4] = 0xba;
  puVar1[5] = 0xca;
  puVar1[6] = '&';
  puVar1[7] = 'O';
  puVar1 = (uchar *)((long)arg + 0x4030);
  puVar1[0] = 0x8f;
  puVar1[1] = 0x8c;
  puVar1[2] = 0xd4;
  puVar1[3] = 0xdd;
  puVar1[4] = '-';
  puVar1[5] = '\x04';
  puVar1[6] = 0xbe;
  puVar1[7] = '0';
  puVar1 = (uchar *)((long)arg + 0x4018);
  puVar1[0] = '\n';
  puVar1[1] = 'd';
  puVar1[2] = 0xca;
  puVar1[3] = '2';
  puVar1[4] = 0x9e;
  puVar1[5] = 0xc6;
  puVar1[6] = ' ';
  puVar1[7] = 'y';
  puVar1 = (uchar *)((long)arg + 0x4020);
  puVar1[0] = '\x03';
  puVar1[1] = 0xf3;
  puVar1[2] = 0xd0;
  puVar1[3] = 'F';
  puVar1[4] = 'z';
  puVar1[5] = '\x0f';
  puVar1[6] = 0xd2;
  puVar1[7] = '!';
  puVar1 = (uchar *)((long)arg + 0x4008);
  puVar1[0] = 'x';
  puVar1[1] = '\x1f';
  puVar1[2] = 0xb7;
  puVar1[3] = 0xd4;
  puVar1[4] = 'g';
  puVar1[5] = '\x7f';
  puVar1[6] = '\b';
  puVar1[7] = 'h';
  puVar1 = (uchar *)((long)arg + 0x4010);
  puVar1[0] = 0xdb;
  puVar1[1] = 0xe3;
  puVar1[2] = '\x1d';
  puVar1[3] = '\x7f';
  puVar1[4] = '\x1b';
  puVar1[5] = 0xb0;
  puVar1[6] = 0xf6;
  puVar1[7] = 0x9e;
  lVar34 = 0;
  do {
    puVar30 = *arg;
    lVar27 = (long)arg + lVar34 * 0x40 + 8;
    iVar19 = secp256k1_ellswift_decode(puVar30,lVar27,lVar29);
    uVar26 = (uint)lVar27;
    if (iVar19 == 0) {
      bench_ellswift_setup_cold_2();
      goto LAB_00102dd7;
    }
    lVar27 = 0x4008;
    iVar19 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                    CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
    in_XMM1_Ba = (char)iVar19;
    in_XMM1_Bb = (char)((uint)iVar19 >> 8);
    in_XMM1_Bc = (char)((uint)iVar19 >> 0x10);
    in_XMM1_Bd = (char)((uint)iVar19 >> 0x18);
    iVar19 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                    CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
    in_XMM1_Be = (char)iVar19;
    in_XMM1_Bf = (char)((uint)iVar19 >> 8);
    in_XMM1_Bg = (char)((uint)iVar19 >> 0x10);
    in_XMM1_Bh = (char)((uint)iVar19 >> 0x18);
    iVar19 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                    CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
    in_XMM1_Bi = (char)iVar19;
    in_XMM1_Bj = (char)((uint)iVar19 >> 8);
    in_XMM1_Bk = (char)((uint)iVar19 >> 0x10);
    in_XMM1_Bl = (char)((uint)iVar19 >> 0x18);
    iVar19 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                    CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
    in_XMM1_Bm = (char)iVar19;
    in_XMM1_Bn = (char)((uint)iVar19 >> 8);
    in_XMM1_Bo = (char)((uint)iVar19 >> 0x10);
    in_XMM1_Bp = (char)((uint)iVar19 >> 0x18);
    do {
      pcVar22 = (char *)((long)arg + lVar27);
      cVar4 = pcVar22[1];
      cVar5 = pcVar22[2];
      cVar6 = pcVar22[3];
      cVar7 = pcVar22[4];
      cVar8 = pcVar22[5];
      cVar9 = pcVar22[6];
      cVar10 = pcVar22[7];
      cVar11 = pcVar22[8];
      cVar12 = pcVar22[9];
      cVar13 = pcVar22[10];
      cVar14 = pcVar22[0xb];
      cVar15 = pcVar22[0xc];
      cVar16 = pcVar22[0xd];
      cVar17 = pcVar22[0xe];
      cVar18 = pcVar22[0xf];
      pcVar33 = (char *)((long)arg + lVar27);
      *pcVar33 = *pcVar22 - in_XMM1_Ba;
      pcVar33[1] = cVar4 - in_XMM1_Bb;
      pcVar33[2] = cVar5 - in_XMM1_Bc;
      pcVar33[3] = cVar6 - in_XMM1_Bd;
      pcVar33[4] = cVar7 - in_XMM1_Be;
      pcVar33[5] = cVar8 - in_XMM1_Bf;
      pcVar33[6] = cVar9 - in_XMM1_Bg;
      pcVar33[7] = cVar10 - in_XMM1_Bh;
      pcVar33[8] = cVar11 - in_XMM1_Bi;
      pcVar33[9] = cVar12 - in_XMM1_Bj;
      pcVar33[10] = cVar13 - in_XMM1_Bk;
      pcVar33[0xb] = cVar14 - in_XMM1_Bl;
      pcVar33[0xc] = cVar15 - in_XMM1_Bm;
      pcVar33[0xd] = cVar16 - in_XMM1_Bn;
      pcVar33[0xe] = cVar17 - in_XMM1_Bo;
      pcVar33[0xf] = cVar18 - in_XMM1_Bp;
      lVar27 = lVar27 + 0x10;
    } while (lVar27 != 0x4048);
    lVar34 = lVar34 + 1;
  } while (lVar34 != 0x100);
  puVar30 = *arg;
  arg = (void *)((long)arg + 0x3fc8);
  iVar19 = secp256k1_ellswift_encode(puVar30,lVar29,arg,bench_ellswift_setup::init + 0x10);
  uVar26 = (uint)lVar29;
  if (iVar19 != 0) {
    return;
  }
LAB_00102dd7:
  bench_ellswift_setup_cold_1();
  if ((int)uVar26 < 1) {
    return;
  }
  puVar2 = puVar30 + 0x801;
  uVar23 = 0;
  pvStack_58 = arg;
  lStack_50 = lVar34;
  while( true ) {
    puVar31 = (undefined8 *)*puVar30;
    pcStack_a8 = (code *)0x102e12;
    puVar28 = auStack_98;
    iVar19 = secp256k1_ellswift_decode(puVar31,auStack_98,puVar2);
    uVar24 = (uint)puVar28;
    if (iVar19 != 1) break;
    uStack_a0 = 0x21;
    puVar31 = (undefined8 *)*puVar30;
    lVar29 = (ulong)((uint)uVar23 & 0x1f) + (long)puVar2;
    pcStack_a8 = (code *)0x102e3b;
    iVar19 = secp256k1_ec_pubkey_serialize(puVar31,lVar29,&uStack_a0,auStack_98,0x102);
    uVar24 = (uint)lVar29;
    if (iVar19 == 0) goto LAB_00102e59;
    uVar24 = (uint)uVar23 + 1;
    uVar23 = (ulong)uVar24;
    if (uVar26 == uVar24) {
      return;
    }
  }
  pcStack_a8 = (code *)0x102e59;
  bench_ellswift_decode_cold_1();
LAB_00102e59:
  pcStack_a8 = bench_ellswift_create;
  bench_ellswift_decode_cold_2();
  if ((int)uVar24 < 1) {
    return;
  }
  puVar3 = puVar31 + 0x801;
  uStack_c8 = (ulong)uVar26;
  puStack_c0 = auStack_98;
  puStack_b8 = (undefined1 *)&uStack_a0;
  puStack_b0 = puVar30;
  pcStack_a8 = (code *)puVar2;
  while( true ) {
    puVar30 = (undefined8 *)*puVar31;
    pcStack_110 = (code *)0x102e96;
    iStack_14c = (int)&uStack_108;
    iVar19 = secp256k1_ellswift_create(puVar30,&uStack_108,puVar3,puVar31 + 0x805);
    if (iVar19 == 0) break;
    puVar31[0x807] = uStack_d8;
    puVar31[0x808] = uStack_d0;
    puVar31[0x805] = uStack_e8;
    puVar31[0x806] = uStack_e0;
    puVar31[0x803] = uStack_f8;
    puVar31[0x804] = uStack_f0;
    *puVar3 = uStack_108;
    puVar31[0x802] = uStack_100;
    uVar24 = uVar24 - 1;
    if (uVar24 == 0) {
      return;
    }
  }
  pcStack_110 = bench_ellswift_xdh;
  bench_ellswift_create_cold_1();
  if (iStack_14c < 1) {
    return;
  }
  puVar2 = puVar30 + 0x801;
  uStack_140 = _secp256k1_ellswift_xdh_hash_function_bip324;
  puVar25 = puVar30 + 0x803;
  uVar35 = 0x10;
  uVar36 = 0;
  puVar37 = puVar2;
  puStack_148 = puVar30;
  uStack_138 = (ulong)uVar24;
  puStack_130 = puVar31 + 0x805;
  puStack_128 = (undefined1 *)&uStack_108;
  puStack_120 = puVar31;
  puStack_118 = puVar3;
  pcStack_110 = (code *)uVar23;
  while( true ) {
    argv = (char **)((long)puVar37 + (uVar36 / 0x21) * -0x21);
    uVar32 = *puStack_148;
    pcStack_158 = (code *)0x0;
    puStack_160 = (undefined8 *)uStack_140;
    puStack_168 = (undefined8 *)0x102f80;
    iVar19 = secp256k1_ellswift_xdh
                       (uVar32,argv,puVar2,puVar2,(long)puVar25 + (uVar35 / 0x21) * -0x21);
    argc = (int)uVar32;
    if (iVar19 != 1) break;
    uVar36 = uVar36 + 1;
    puVar25 = (undefined8 *)((long)puVar25 + 1);
    uVar35 = uVar35 + 1;
    puVar37 = (undefined8 *)((long)puVar37 + 1);
    if (iStack_14c == (int)uVar36) {
      return;
    }
  }
  pcStack_158 = main;
  bench_ellswift_xdh_cold_1();
  uStack_180 = 0xf83e0f83e0f83e1;
  uStack_178 = uVar35;
  uStack_170 = uVar36;
  puStack_168 = puVar2;
  puStack_160 = puVar37;
  pcStack_158 = (code *)puVar25;
  pcVar22 = getenv("SECP256K1_BENCH_ITERS");
  if (pcVar22 == (char *)0x0) {
    uVar23 = 20000;
  }
  else {
    uVar23 = strtol(pcVar22,(char **)0x0,0);
  }
  lVar29 = (long)argc;
  if (argc != 1) {
    ppcStack_2e0 = argv + 1;
    do {
      pcVar22 = *ppcStack_2e0;
      lVar34 = 0;
      while( true ) {
        pcVar33 = pcVar22;
        iVar19 = strcmp(pcVar22,*(char **)((long)&PTR_anon_var_dwarf_d5_00108d20 + lVar34));
        iVar21 = (int)pcVar33;
        if (iVar19 == 0) break;
        lVar34 = lVar34 + 8;
        if (lVar34 == 0xa8) goto LAB_0010305e;
      }
      ppcStack_2e0 = ppcStack_2e0 + 1;
    } while (ppcStack_2e0 != argv + lVar29);
LAB_0010305e:
    if (1 < argc) {
      lVar34 = lVar29 * 8;
      lVar27 = 8;
      do {
        pcVar22 = *(char **)((long)argv + lVar27);
        if (((*pcVar22 == '-') && (pcVar22[1] == 'h')) && (pcVar22[2] == '\0')) goto LAB_001030e7;
        lVar27 = lVar27 + 8;
      } while (lVar34 - lVar27 != 0);
      lVar27 = 8;
      do {
        if (lVar34 - lVar27 == 0) {
          lVar27 = 8;
          goto LAB_001030ce;
        }
        pcVar22 = *(char **)((long)argv + lVar27);
        iVar20 = strcmp(pcVar22,"--help");
        iVar21 = (int)pcVar22;
        lVar27 = lVar27 + 8;
      } while (iVar20 != 0);
      goto LAB_001030e7;
    }
  }
LAB_00103103:
  lVar29 = lVar29 * 8;
  lVar34 = 8;
  do {
    if (lVar29 == lVar34) {
      lVar34 = 8;
      goto LAB_0010313c;
    }
    iVar19 = strcmp(*(char **)((long)argv + lVar34),"recover");
    lVar34 = lVar34 + 8;
  } while (iVar19 != 0);
  goto LAB_00103155;
  while( true ) {
    iVar21 = strcmp(*(char **)((long)argv + lVar34),"ecdsa");
    lVar34 = lVar34 + 8;
    if (iVar21 == 0) break;
LAB_00103297:
    if (lVar29 == lVar34) {
      lVar34 = 8;
      goto LAB_001032bf;
    }
  }
  goto LAB_00103300;
  while( true ) {
    iVar21 = strcmp(*(char **)((long)argv + lVar34),"verify");
    lVar34 = lVar34 + 8;
    if (iVar21 == 0) break;
LAB_001032bf:
    if (lVar29 == lVar34) {
      lVar34 = 8;
      goto LAB_001032e7;
    }
  }
  goto LAB_00103300;
  while( true ) {
    iVar21 = strcmp(*(char **)((long)argv + lVar34),"sign");
    lVar34 = lVar34 + 8;
    if (iVar21 == 0) break;
LAB_00103357:
    if (lVar29 == lVar34) {
      lVar34 = 8;
      goto LAB_0010337f;
    }
  }
  goto LAB_00103398;
  while( true ) {
    iVar21 = strcmp(*(char **)((long)argv + lVar34),"ecdsa_sign");
    lVar34 = lVar34 + 8;
    if (iVar21 == 0) break;
LAB_0010337f:
    if (lVar29 == lVar34) goto LAB_001033ba;
  }
  goto LAB_00103398;
  while( true ) {
    iVar20 = strcmp(*(char **)((long)argv + lVar34),"ec_keygen");
    iVar21 = (int)uVar32;
    lVar34 = lVar34 + 8;
    if (iVar20 == 0) break;
LAB_00103417:
    if (lVar29 == lVar34) goto LAB_00103458;
  }
  goto LAB_00103430;
  while( true ) {
    pcVar22 = *(char **)((long)argv + lVar27);
    iVar20 = strcmp(pcVar22,"help");
    iVar21 = (int)pcVar22;
    lVar27 = lVar27 + 8;
    if (iVar20 == 0) break;
LAB_001030ce:
    if (lVar34 - lVar27 == 0) {
      if (iVar19 != 0) {
        main_cold_1();
        return;
      }
      goto LAB_00103103;
    }
  }
LAB_001030e7:
  help(iVar21);
  return;
  while( true ) {
    iVar19 = strcmp(*(char **)((long)argv + lVar34),"ecdsa_recover");
    lVar34 = lVar34 + 8;
    if (iVar19 == 0) break;
LAB_0010313c:
    if (lVar29 == lVar34) {
      uStack_2c8 = secp256k1_context_create(1);
      uStack_2c0 = 0x807060504030201;
      uStack_2b8 = 0x100f0e0d0c0b0a09;
      uStack_2b0 = 0x1817161514131211;
      uStack_2a8 = 0x201f1e1d1c1b1a19;
      uStack_2a0 = 0x2827262524232221;
      uStack_298 = 0x302f2e2d2c2b2a29;
      uStack_290 = 0x3837363534333231;
      uStack_288 = 0x403f3e3d3c3b3a39;
      uStack_238 = 0x48;
      uVar32 = 0;
      iVar19 = secp256k1_ecdsa_sign(uStack_2c8,auStack_200,&uStack_2c0,&uStack_2a0,0);
      if (iVar19 == 0) {
        main_cold_6();
LAB_001034ae:
        main_cold_5();
      }
      else {
        iVar19 = secp256k1_ecdsa_signature_serialize_der
                           (uStack_2c8,auStack_280,&uStack_238,auStack_200);
        if (iVar19 == 0) goto LAB_001034ae;
        iVar19 = secp256k1_ec_pubkey_create(uStack_2c8,auStack_1c0,&uStack_2a0);
        if (iVar19 != 0) {
          uStack_208 = 0x21;
          iVar19 = secp256k1_ec_pubkey_serialize
                             (uStack_2c8,auStack_230,&uStack_208,auStack_1c0,0x102);
          if (iVar19 != 1) goto LAB_001034b8;
          printf("%-30s,%-15s,%-15s,%-15s\n","Benchmark","    Min(us)    ","    Avg(us)    ",
                 "    Max(us)    ");
          putchar(10);
          iVar19 = (int)uVar23;
          if (argc == 1) goto LAB_00103300;
          lVar34 = 8;
          goto LAB_00103297;
        }
      }
      main_cold_4();
LAB_001034b8:
      main_cold_3();
      puts("Benchmarks the following algorithms:");
      puts("    - ECDSA signing/verification");
      puts("    - ECDH key exchange (optional module)");
      puts("    - Schnorr signatures (optional module)");
      puts("    - ElligatorSwift (optional module)");
      putchar(10);
      printf("The default number of iterations for each benchmark is %d. This can be\n",20000);
      puts("customized using the SECP256K1_BENCH_ITERS environment variable.");
      putchar(10);
      puts("Usage: ./bench [args]");
      puts("By default, all benchmarks will be run.");
      puts("args:");
      puts("    help              : display this help and exit");
      puts("    ecdsa             : all ECDSA algorithms--sign, verify, recovery (if enabled)");
      puts("    ecdsa_sign        : ECDSA siging algorithm");
      puts("    ecdsa_verify      : ECDSA verification algorithm");
      puts("    ec                : all EC public key algorithms (keygen)");
      puts("    ec_keygen         : EC public key generation");
      puts("    ecdh              : ECDH key exchange algorithm");
      puts("    schnorrsig        : all Schnorr signature algorithms (sign, verify)");
      puts("    schnorrsig_sign   : Schnorr sigining algorithm");
      puts("    schnorrsig_verify : Schnorr verification algorithm");
      puts("    ellswift          : all ElligatorSwift benchmarks (encode, decode, keygen, ecdh)");
      puts("    ellswift_encode   : ElligatorSwift encoding");
      puts("    ellswift_decode   : ElligatorSwift decoding");
      puts("    ellswift_keygen   : ElligatorSwift key generation");
      puts("    ellswift_ecdh     : ECDH on ElligatorSwift keys");
      putchar(10);
      return;
    }
  }
LAB_00103155:
  main_cold_2();
  return;
  while( true ) {
    iVar21 = strcmp(*(char **)((long)argv + lVar34),"ecdsa_verify");
    lVar34 = lVar34 + 8;
    if (iVar21 == 0) break;
LAB_001032e7:
    if (lVar29 == lVar34) goto LAB_0010331d;
  }
LAB_00103300:
  run_benchmark("ecdsa_verify",bench_verify,(_func_void_void_ptr *)0x0,
                (_func_void_void_ptr_int *)&uStack_2c8,(void *)(uVar23 & 0xffffffff),(int)uVar32,
                in_stack_fffffffffffffd18);
LAB_0010331d:
  if (argc != 1) {
    lVar34 = 8;
    do {
      if (lVar29 == lVar34) {
        lVar34 = 8;
        goto LAB_00103357;
      }
      iVar21 = strcmp(*(char **)((long)argv + lVar34),"ecdsa");
      lVar34 = lVar34 + 8;
    } while (iVar21 != 0);
  }
LAB_00103398:
  run_benchmark("ecdsa_sign",bench_sign_run,bench_sign_setup,(_func_void_void_ptr_int *)&uStack_2c8,
                (void *)(uVar23 & 0xffffffff),(int)uVar32,in_stack_fffffffffffffd18);
LAB_001033ba:
  iVar21 = (int)uVar32;
  if (argc != 1) {
    lVar34 = 8;
    do {
      pcVar22 = *(char **)((long)argv + lVar34);
      if (((*pcVar22 == 'e') && (pcVar22[1] == 'c')) && (pcVar22[2] == '\0')) goto LAB_00103430;
      lVar34 = lVar34 + 8;
    } while (lVar29 != lVar34);
    lVar34 = 8;
    do {
      if (lVar29 == lVar34) {
        lVar34 = 8;
        goto LAB_00103417;
      }
      iVar20 = strcmp(*(char **)((long)argv + lVar34),"keygen");
      iVar21 = (int)uVar32;
      lVar34 = lVar34 + 8;
    } while (iVar20 != 0);
  }
LAB_00103430:
  run_benchmark("ec_keygen",bench_keygen_run,bench_keygen_setup,
                (_func_void_void_ptr_int *)&uStack_2c8,(void *)(uVar23 & 0xffffffff),iVar21,
                in_stack_fffffffffffffd18);
LAB_00103458:
  secp256k1_context_destroy(uStack_2c8);
  run_ecdh_bench(iVar19,argc,argv);
  run_schnorrsig_bench(iVar19,argc,argv);
  run_ellswift_bench(iVar19,argc,argv);
  return;
}

Assistant:

static void bench_ellswift_setup(void *arg) {
    int i;
    bench_ellswift_data *data = (bench_ellswift_data*)arg;
    static const unsigned char init[64] = {
        0x78, 0x1f, 0xb7, 0xd4, 0x67, 0x7f, 0x08, 0x68,
        0xdb, 0xe3, 0x1d, 0x7f, 0x1b, 0xb0, 0xf6, 0x9e,
        0x0a, 0x64, 0xca, 0x32, 0x9e, 0xc6, 0x20, 0x79,
        0x03, 0xf3, 0xd0, 0x46, 0x7a, 0x0f, 0xd2, 0x21,
        0xb0, 0x2c, 0x46, 0xd8, 0xba, 0xca, 0x26, 0x4f,
        0x8f, 0x8c, 0xd4, 0xdd, 0x2d, 0x04, 0xbe, 0x30,
        0x48, 0x51, 0x1e, 0xd4, 0x16, 0xfd, 0x42, 0x85,
        0x62, 0xc9, 0x02, 0xf9, 0x89, 0x84, 0xff, 0xdc
    };
    memcpy(data->rnd64, init, 64);
    for (i = 0; i < 256; ++i) {
        int j;
        CHECK(secp256k1_ellswift_decode(data->ctx, &data->point[i], data->rnd64));
        for (j = 0; j < 64; ++j) {
            data->rnd64[j] += 1;
        }
    }
    CHECK(secp256k1_ellswift_encode(data->ctx, data->rnd64, &data->point[255], init + 16));
}